

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_TestHarness_c_checkLongLongInt_TestShell::createTest
          (TEST_TestHarness_c_checkLongLongInt_TestShell *this)

{
  TEST_TestHarness_c_checkLongLongInt_Test *this_00;
  
  this_00 = (TEST_TestHarness_c_checkLongLongInt_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x106);
  TEST_TestHarness_c_checkLongLongInt_Test::TEST_TestHarness_c_checkLongLongInt_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, checkLongLongInt)
{
    CHECK_EQUAL_C_LONGLONG(2, 2);
    fixture->setTestFunction(failLongLongIntMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}